

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCACore.cpp
# Opt level: O3

HRESULT Js::SCACore::ValidateTransferableVars(Var *vars,size_t count)

{
  Type TVar1;
  Var aValue;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  RecyclableObject *this;
  char *message;
  char *error;
  uint lineNumber;
  char *fileName;
  size_t sVar6;
  
  if (count != 0) {
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    sVar6 = 0;
    do {
      aValue = vars[sVar6];
      if (aValue != (Var)0x0) {
        if (((ulong)aValue & 0x1ffff00000000) == 0x1000000000000 ||
            ((ulong)aValue & 0xffff000000000000) != 0x1000000000000) {
          if (((ulong)aValue >> 0x32 == 0) &&
             (((ulong)aValue & 0xffff000000000000) != 0x1000000000000)) goto LAB_00f07fdc;
        }
        else {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar5 = 1;
          fileName = 
          "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/SCACore/../Runtime/Language/TaggedInt.inl"
          ;
          error = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
          message = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
          lineNumber = 0x2a;
LAB_00f080d3:
          bVar3 = Throw::ReportAssert(fileName,lineNumber,error,message);
          if (!bVar3) goto LAB_00f08133;
          *puVar5 = 0;
        }
LAB_00f080e2:
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/SCACore/SCACore.cpp"
                                    ,0x14,"(false)",
                                    "These should have been filtered out by the host.");
        if (bVar3) {
          *puVar5 = 0;
          return -0x7ffbeffd;
        }
LAB_00f08133:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/SCACore/../Runtime/Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00f08133;
      *puVar5 = 0;
LAB_00f07fdc:
      this = UnsafeVarTo<Js::RecyclableObject>(aValue);
      if (this == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/SCACore/../Runtime/Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar3) goto LAB_00f08133;
        *puVar5 = 0;
      }
      TVar1 = ((this->type).ptr)->typeId;
      if (0x57 < (int)TVar1) {
        BVar4 = RecyclableObject::IsExternal(this);
        if (BVar4 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar5 = 1;
          fileName = 
          "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/SCACore/../Runtime/Language/JavascriptOperators.inl"
          ;
          error = "(typeId < TypeIds_Limit || obj->IsExternal())";
          message = "GetTypeId aValue has invalid TypeId";
          lineNumber = 0xe;
          goto LAB_00f080d3;
        }
        goto LAB_00f080e2;
      }
      if (TVar1 != TypeIds_ArrayBuffer) goto LAB_00f080e2;
      bVar3 = JavascriptOperators::IsObjectDetached(vars[sVar6]);
      if (bVar3) {
        return -0x7ffbeffc;
      }
      sVar6 = sVar6 + 1;
    } while (count != sVar6);
  }
  return 0;
}

Assistant:

HRESULT ValidateTransferableVars(Var *vars, size_t count)
        {
            for (size_t i = 0; i < count; i++)
            {
                Js::TypeId typeId = Js::JavascriptOperators::GetTypeId(vars[i]);
                if (typeId != TypeIds_ArrayBuffer)
                {

                    AssertMsg(false, "These should have been filtered out by the host.");
                    return E_SCA_TRANSFERABLE_UNSUPPORTED;
                }

                if (Js::JavascriptOperators::IsObjectDetached(vars[i]))
                {
                    return E_SCA_TRANSFERABLE_NEUTERED;
                }
            }
            return S_OK;
        }